

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

void canvas_displaceselection(_glist *x,int dx,int dy)

{
  _class *p_Var1;
  bool bVar2;
  bool bVar3;
  void *data;
  _class *cl;
  int resortout;
  int resortin;
  t_selection *y;
  int dy_local;
  int dx_local;
  _glist *x_local;
  
  bVar2 = false;
  bVar3 = false;
  if ((x->gl_editor->e_selection != (t_selection *)0x0) &&
     (*(int *)((pd_maininstance.pd_gui)->i_editor + 0x40) == 0)) {
    data = canvas_undo_set_move(x,1);
    canvas_undo_add(x,UNDO_MOTION,"motion",data);
    *(undefined4 *)((pd_maininstance.pd_gui)->i_editor + 0x40) = 1;
  }
  for (_resortout = x->gl_editor->e_selection; _resortout != (t_selection *)0x0;
      _resortout = _resortout->sel_next) {
    p_Var1 = _resortout->sel_what->g_pd;
    gobj_displace(_resortout->sel_what,x,dx,dy);
    if (p_Var1 == vinlet_class) {
      bVar2 = true;
    }
    else if (p_Var1 == voutlet_class) {
      bVar3 = true;
    }
  }
  if (bVar2) {
    canvas_resortinlets(x);
  }
  if (bVar3) {
    canvas_resortoutlets(x);
  }
  pdgui_vmess("pdtk_canvas_getscroll","c",x);
  if (x->gl_editor->e_selection != (t_selection *)0x0) {
    canvas_dirty(x,1.0);
  }
  return;
}

Assistant:

static void canvas_displaceselection(t_canvas *x, int dx, int dy)
{
    t_selection *y;
    int resortin = 0, resortout = 0;
    if (x->gl_editor->e_selection && !EDITOR->canvas_undo_already_set_move)
    {
        canvas_undo_add(x, UNDO_MOTION, "motion", canvas_undo_set_move(x, 1));
        EDITOR->canvas_undo_already_set_move = 1;
    }
    for (y = x->gl_editor->e_selection; y; y = y->sel_next)
    {
        t_class *cl = pd_class(&y->sel_what->g_pd);
        gobj_displace(y->sel_what, x, dx, dy);
        if (cl == vinlet_class) resortin = 1;
        else if (cl == voutlet_class) resortout = 1;
    }
    if (resortin) canvas_resortinlets(x);
    if (resortout) canvas_resortoutlets(x);
    pdgui_vmess("pdtk_canvas_getscroll", "c", x);
    if (x->gl_editor->e_selection)
        canvas_dirty(x, 1);
}